

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariter.cpp
# Opt level: O2

CharacterIterator * __thiscall
icu_63::CharacterIterator::operator=(CharacterIterator *this,CharacterIterator *that)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  
  iVar1 = that->pos;
  iVar2 = that->begin;
  iVar3 = that->end;
  this->textLength = that->textLength;
  this->pos = iVar1;
  this->begin = iVar2;
  this->end = iVar3;
  return this;
}

Assistant:

CharacterIterator &
CharacterIterator::operator=(const CharacterIterator &that) {
    ForwardCharacterIterator::operator=(that);
    textLength = that.textLength;
    pos = that.pos;
    begin = that.begin;
    end = that.end;
    return *this;
}